

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svsetbase.h
# Opt level: O0

void __thiscall soplex::SVSetBase<double>::countUnusedMem(SVSetBase<double> *this)

{
  int iVar1;
  DLPSV *in_RDI;
  IdList<soplex::SVSetBase<double>::DLPSV> *unaff_retaddr;
  DLPSV *ps;
  DLPSV *local_10;
  DLPSV *elem;
  
  elem = in_RDI;
  iVar1 = memSize((SVSetBase<double> *)0x22f167);
  *(int *)&in_RDI[2].theprev = iVar1;
  local_10 = IdList<soplex::SVSetBase<double>::DLPSV>::first
                       ((IdList<soplex::SVSetBase<double>::DLPSV> *)(in_RDI + 2));
  while (local_10 != (DLPSV *)0x0) {
    iVar1 = SVectorBase<double>::size(&local_10->super_SVectorBase<double>);
    *(int *)&in_RDI[2].theprev = *(int *)&in_RDI[2].theprev - iVar1;
    local_10 = IdList<soplex::SVSetBase<double>::DLPSV>::next(unaff_retaddr,elem);
  }
  *(undefined4 *)((long)&in_RDI[2].theprev + 4) = 0;
  return;
}

Assistant:

void countUnusedMem()
   {
#ifdef SOPLEX_DEBUG
      SPxOut::debug(this,
                    "counting unused memory (unusedMem = {}, numUnusedMemUpdates = {}, this = {})\n",
                    unusedMem, numUnusedMemUpdates, (void*)this);
#endif

      unusedMem = memSize();

      for(DLPSV* ps = list.first(); ps; ps = list.next(ps))
         unusedMem -= ps->size();

      numUnusedMemUpdates = 0;

#ifdef SOPLEX_DEBUG
      SPxOut::debug(this, "               --> NEW: unusedMem = {}\n", unusedMem);
#endif
   }